

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.cpp
# Opt level: O2

bool __thiscall OpenMD::SelectionCompiler::clauseOr(SelectionCompiler *this)

{
  bool bVar1;
  int iVar2;
  Token tokenOr;
  Token TStack_38;
  
  bVar1 = clauseAnd(this);
  if (bVar1) {
    while( true ) {
      iVar2 = tokPeek(this);
      if (iVar2 != 0x404) break;
      tokenNext(&TStack_38,this);
      bVar1 = clauseAnd(this);
      if (!bVar1) {
        std::any::reset(&TStack_38.value);
        goto LAB_0022beff;
      }
      std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::push_back
                (&this->ltokenPostfix,&TStack_38);
      std::any::reset(&TStack_38.value);
    }
    bVar1 = true;
  }
  else {
LAB_0022beff:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool SelectionCompiler::clauseOr() {
    if (!clauseAnd()) { return false; }

    while (tokPeek() == Token::opOr) {
      Token tokenOr = tokenNext();
      if (!clauseAnd()) { return false; }
      addTokenToPostfix(tokenOr);
    }
    return true;
  }